

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O3

SubItem * __thiscall ON_Displacement::AddSubItem(ON_Displacement *this)

{
  SubItem *pSVar1;
  SubItem *sub;
  ON_XMLNode node;
  SubItem *local_100;
  ON_XMLNode local_f8;
  
  ON_XMLNode::ON_XMLNode(&local_f8,L"sub");
  pSVar1 = (SubItem *)operator_new(8);
  SubItem::SubItem(pSVar1,&local_f8);
  local_100 = pSVar1;
  ON_SimpleArray<ON_Displacement::SubItem_*>::Append(&this->m_impl_dsp->m_subs,&local_100);
  pSVar1 = local_100;
  ON_XMLRootNode::~ON_XMLRootNode((ON_XMLRootNode *)&local_f8);
  return pSVar1;
}

Assistant:

ON_Displacement::SubItem& ON_Displacement::AddSubItem(void)
{
  ON_XMLNode node(ON_DISPLACEMENT_SUB);
  auto* sub = new SubItem(node);
  m_impl_dsp->m_subs.Append(sub);

  return *sub;
}